

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O2

bool __thiscall FIX::Message::isApp(Message *this)

{
  bool bVar1;
  MsgType msgType;
  FieldBase FStack_68;
  
  MsgType::MsgType((MsgType *)&FStack_68);
  bVar1 = FieldMap::getFieldIfSet(&(this->m_header).super_FieldMap,&FStack_68);
  if (bVar1) {
    bVar1 = isAdminMsgType((MsgType *)&FStack_68);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  FieldBase::~FieldBase(&FStack_68);
  return bVar1;
}

Assistant:

bool isApp() const {
    MsgType msgType;
    if (m_header.getFieldIfSet(msgType)) {
      return !isAdminMsgType(msgType);
    }
    return false;
  }